

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_copy_logical_type
          (CompilerGLSL *this,uint32_t lhs_id,uint32_t lhs_type_id,uint32_t rhs_id,
          uint32_t rhs_type_id,SmallVector<unsigned_int,_8UL> *chain)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  uint32_t lhs_type_id_00;
  uint32_t rhs_type_id_00;
  size_t sVar1;
  uint32_t uVar2;
  SPIRType *type;
  SPIRExpression *pSVar3;
  uint32_t i;
  uint32_t uVar4;
  ulong uVar5;
  bool local_131;
  uint32_t rhs_id_local;
  uint32_t lhs_id_local;
  uint32_t local_128;
  uint32_t local_124;
  uint32_t rhs_type_id_local;
  uint32_t lhs_type_id_local;
  SPIRType *local_118;
  SPIRType *local_110;
  CompilerGLSL *local_108;
  AccessChainMeta rhs_meta;
  AccessChainMeta lhs_meta;
  string lhs;
  string rhs;
  SmallVector<unsigned_int,_8UL> local_a0;
  SmallVector<unsigned_int,_8UL> local_68;
  
  rhs_id_local = rhs_id;
  lhs_id_local = lhs_id;
  local_128 = lhs_id;
  local_124 = rhs_id;
  rhs_type_id_local = rhs_type_id;
  lhs_type_id_local = lhs_type_id;
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,lhs_type_id);
  local_110 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,rhs_type_id);
  local_118 = type;
  local_108 = this;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->basetype == Struct) {
      lhs._M_dataplus._M_p._0_4_ = 0;
      SmallVector<unsigned_int,_8UL>::push_back(chain,(uint *)&lhs);
      sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      for (uVar5 = 0; (uint)sVar1 != uVar5; uVar5 = uVar5 + 1) {
        (chain->super_VectorView<unsigned_int>).ptr
        [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = (uint)uVar5;
        uVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                ptr[uVar5].id;
        uVar4 = (local_110->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar5].id;
        SmallVector<unsigned_int,_8UL>::SmallVector(&local_a0,chain);
        emit_copy_logical_type(local_108,local_128,uVar2,local_124,uVar4,&local_a0);
        SmallVector<unsigned_int,_8UL>::~SmallVector(&local_a0);
        type = local_118;
      }
    }
    else {
      lhs_meta.relaxed_precision = false;
      lhs_meta.access_meshlet_position_y = false;
      lhs_meta.storage_physical_type = 0;
      lhs_meta.need_transpose = false;
      lhs_meta.storage_is_packed = false;
      lhs_meta.storage_is_invariant = false;
      lhs_meta.flattened_struct = false;
      rhs_meta.relaxed_precision = false;
      rhs_meta.access_meshlet_position_y = false;
      rhs_meta.storage_physical_type = 0;
      rhs_meta.need_transpose = false;
      rhs_meta.storage_is_packed = false;
      rhs_meta.storage_is_invariant = false;
      rhs_meta.flattened_struct = false;
      access_chain_internal_abi_cxx11_
                (&lhs,this,local_128,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&lhs_meta);
      access_chain_internal_abi_cxx11_
                (&rhs,this,local_124,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&rhs_meta);
      uVar2 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
      uVar4 = uVar2 + 1;
      local_131 = true;
      rhs_id_local = uVar4;
      lhs_id_local = uVar2;
      pSVar3 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,uVar2,&lhs,&lhs_type_id_local,&local_131);
      pSVar3->need_transpose = lhs_meta.need_transpose;
      if (lhs_meta.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar2,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (lhs_meta.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar2,SPIRVCrossDecorationPhysicalTypeID,
                   lhs_meta.storage_physical_type);
      }
      this_00 = &(this->super_Compiler).forwarded_temporaries;
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this_00,&lhs_id_local);
      this_01 = &(this->super_Compiler).suppressed_usage_tracking;
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this_01,&lhs_id_local);
      local_131 = true;
      pSVar3 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,uVar4,&rhs,&rhs_type_id_local,&local_131);
      pSVar3->need_transpose = rhs_meta.need_transpose;
      if (rhs_meta.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar4,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (rhs_meta.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar4,SPIRVCrossDecorationPhysicalTypeID,
                   rhs_meta.storage_physical_type);
      }
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this_00,&rhs_id_local);
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this_01,&rhs_id_local);
      (*(this->super_Compiler)._vptr_Compiler[0x41])(this,(ulong)lhs_id_local,(ulong)rhs_id_local);
      ::std::__cxx11::string::~string((string *)&rhs);
      ::std::__cxx11::string::~string((string *)&lhs);
    }
  }
  else {
    uVar2 = to_array_size_literal(this,type);
    lhs._M_dataplus._M_p._0_4_ = 0;
    SmallVector<unsigned_int,_8UL>::push_back(chain,(uint *)&lhs);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      (chain->super_VectorView<unsigned_int>).ptr
      [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = uVar4;
      lhs_type_id_00 = (type->parent_type).id;
      rhs_type_id_00 = (local_110->parent_type).id;
      SmallVector<unsigned_int,_8UL>::SmallVector(&local_68,chain);
      emit_copy_logical_type(local_108,local_128,lhs_type_id_00,local_124,rhs_type_id_00,&local_68);
      SmallVector<unsigned_int,_8UL>::~SmallVector(&local_68);
      type = local_118;
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_copy_logical_type(uint32_t lhs_id, uint32_t lhs_type_id, uint32_t rhs_id, uint32_t rhs_type_id,
                                          SmallVector<uint32_t> chain)
{
	// Fully unroll all member/array indices one by one.

	auto &lhs_type = get<SPIRType>(lhs_type_id);
	auto &rhs_type = get<SPIRType>(rhs_type_id);

	if (!lhs_type.array.empty())
	{
		// Could use a loop here to support specialization constants, but it gets rather complicated with nested array types,
		// and this is a rather obscure opcode anyways, keep it simple unless we are forced to.
		uint32_t array_size = to_array_size_literal(lhs_type);
		chain.push_back(0);

		for (uint32_t i = 0; i < array_size; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.parent_type, rhs_id, rhs_type.parent_type, chain);
		}
	}
	else if (lhs_type.basetype == SPIRType::Struct)
	{
		chain.push_back(0);
		uint32_t member_count = uint32_t(lhs_type.member_types.size());
		for (uint32_t i = 0; i < member_count; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.member_types[i], rhs_id, rhs_type.member_types[i], chain);
		}
	}
	else
	{
		// Need to handle unpack/packing fixups since this can differ wildly between the logical types,
		// particularly in MSL.
		// To deal with this, we emit access chains and go through emit_store_statement
		// to deal with all the special cases we can encounter.

		AccessChainMeta lhs_meta, rhs_meta;
		auto lhs = access_chain_internal(lhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &lhs_meta);
		auto rhs = access_chain_internal(rhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &rhs_meta);

		uint32_t id = ir.increase_bound_by(2);
		lhs_id = id;
		rhs_id = id + 1;

		{
			auto &lhs_expr = set<SPIRExpression>(lhs_id, std::move(lhs), lhs_type_id, true);
			lhs_expr.need_transpose = lhs_meta.need_transpose;

			if (lhs_meta.storage_is_packed)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (lhs_meta.storage_physical_type != 0)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypeID, lhs_meta.storage_physical_type);

			forwarded_temporaries.insert(lhs_id);
			suppressed_usage_tracking.insert(lhs_id);
		}

		{
			auto &rhs_expr = set<SPIRExpression>(rhs_id, std::move(rhs), rhs_type_id, true);
			rhs_expr.need_transpose = rhs_meta.need_transpose;

			if (rhs_meta.storage_is_packed)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (rhs_meta.storage_physical_type != 0)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypeID, rhs_meta.storage_physical_type);

			forwarded_temporaries.insert(rhs_id);
			suppressed_usage_tracking.insert(rhs_id);
		}

		emit_store_statement(lhs_id, rhs_id);
	}
}